

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

bool __thiscall ON_OutlineFigure::IsValidFigure(ON_OutlineFigure *this,bool bLogErrors)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  ON_OutlineFigurePoint *pOVar4;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ON__UINT16 OVar14;
  bool bVar15;
  bool bVar16;
  ON__UINT32 OVar17;
  int iVar18;
  int iVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ON_OutlineFigurePoint *pOVar24;
  ON_OutlineFigurePoint p1;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint figure_end;
  ON_OutlineFigurePoint local_68;
  uint local_5c;
  ulong local_58;
  ON_OutlineFigurePoint local_50;
  ON_OutlineFigurePoint local_40;
  
  OVar17 = Internal_FigureEndDex(this,bLogErrors);
  if (OVar17 == 0) {
LAB_0049746f:
    bVar15 = false;
  }
  else {
    pOVar4 = (this->m_points).m_a;
    local_50.m_point.y = (pOVar4->m_point).y;
    local_50.m_point_type = pOVar4->m_point_type;
    local_50.m_point_proximity = pOVar4->m_point_proximity;
    local_50.m_figure_index = pOVar4->m_figure_index;
    local_50.m_point.x = (pOVar4->m_point).x;
    bVar15 = ON_OutlineFigurePoint::IsBeginFigurePoint(&local_50);
    if (bVar15) {
      if (local_50.m_point_type == BeginFigureUnknown) {
        if (!bLogErrors) goto LAB_0049746f;
        pcVar20 = 
        "m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.";
        bVar15 = false;
        iVar19 = 0xaa5;
      }
      else {
        OVar14 = local_50.m_figure_index;
        if (local_50.m_figure_index == 0) {
          if (!bLogErrors) goto LAB_0049746f;
          pcVar20 = "BeginFigure point has 0 = m_contour_index.";
          bVar15 = false;
          iVar19 = 0xaac;
        }
        else {
          pOVar24 = pOVar4 + OVar17;
          local_40.m_point_type = pOVar24->m_point_type;
          local_40.m_point_proximity = pOVar24->m_point_proximity;
          local_40.m_figure_index = pOVar24->m_figure_index;
          local_40.m_point.x = (pOVar24->m_point).x;
          local_40.m_point.y = pOVar4[OVar17].m_point.y;
          if (local_50.m_figure_index == local_40.m_figure_index) {
            bVar15 = ON_OutlineFigurePoint::IsOnFigure(&local_50);
            if (bVar15) {
              bVar15 = ON_OutlineFigurePoint::IsOnFigure(&local_40);
              if (bVar15) {
                if (local_50.m_point_type == BeginFigureOpen) {
                  if (local_40.m_point_type == EndFigureOpen) {
LAB_0049714a:
                    bVar15 = OVar17 == 1;
                    if (bVar15) {
                      return bVar15;
                    }
                    uVar23 = 1;
                    do {
                      pOVar24 = pOVar4 + uVar23;
                      uVar1 = pOVar24->m_point_type;
                      uVar5 = pOVar24->m_point_proximity;
                      uVar8 = pOVar24->m_figure_index;
                      uVar11 = (pOVar24->m_point).x;
                      local_68.m_point.y = pOVar4[uVar23].m_point.y;
                      local_68.m_point_type = uVar1;
                      local_68.m_point_proximity = uVar5;
                      local_68.m_figure_index = uVar8;
                      local_68.m_point.x = (float)uVar11;
                      if (OVar14 != uVar8) {
                        if (!bLogErrors) {
                          return bVar15;
                        }
                        pcVar20 = 
                        "BeginFigure and interior point have different m_contour_index values.";
                        iVar19 = 0xae4;
                        goto LAB_00496fdd;
                      }
                      if (uVar1 == CubicBezierPoint) {
                        bVar16 = ON_OutlineFigurePoint::IsOffFigure(&local_68);
                        if (!bVar16) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "Interior CubicBezierPoint point IsOffFigure() is false.";
                          iVar19 = 0xb19;
                          goto LAB_00496fdd;
                        }
                        pOVar24 = pOVar4 + ((int)uVar23 + 1);
                        uVar21 = 0;
                        iVar19 = 0;
                        local_58 = uVar23;
                        do {
                          iVar18 = iVar19;
                          iVar19 = (int)local_58;
                          if (OVar17 <= iVar19 + iVar18 + 1U) {
                            uVar23 = (ulong)(uint)(iVar19 + iVar18);
                            if (bLogErrors) {
                              iVar19 = 0xb21;
                              pcVar20 = "Invalid CubicBezierPoint segment.";
LAB_0049738a:
                              uVar21 = uVar21 & 0xffffffff;
                              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                         ,iVar19,"",pcVar20);
                            }
                            goto LAB_0049739a;
                          }
                          uVar3 = pOVar24->m_point_type;
                          uVar7 = pOVar24->m_point_proximity;
                          uVar10 = pOVar24->m_figure_index;
                          uVar13 = (pOVar24->m_point).x;
                          local_68.m_point.y = (pOVar24->m_point).y;
                          local_68.m_point_type = uVar3;
                          local_68.m_point_proximity = uVar7;
                          local_68.m_figure_index = uVar10;
                          local_68.m_point.x = (float)uVar13;
                          if (OVar14 != uVar10) {
                            uVar23 = (ulong)(iVar19 + iVar18 + 1);
                            if (bLogErrors) {
                              iVar19 = 0xb28;
                              pcVar20 = 
                              "BeginFigure and interior point have different m_contour_index values."
                              ;
                              goto LAB_0049738a;
                            }
                            goto LAB_0049739a;
                          }
                          if (uVar3 != CubicBezierPoint) {
                            uVar23 = (ulong)(iVar19 + iVar18 + 1);
                            if (bLogErrors) {
                              iVar19 = 0xb2e;
                              pcVar20 = "Invalid end of QuadraticBezier segment point type.";
                              goto LAB_0049738a;
                            }
                            goto LAB_0049739a;
                          }
                          local_5c = (uint)uVar21;
                          if (iVar18 == 0) {
                            bVar16 = ON_OutlineFigurePoint::IsOffFigure(&local_68);
                            if (!bVar16) {
                              uVar23 = (ulong)((int)local_58 + 1);
                              if (bLogErrors) {
                                iVar19 = 0xb36;
                                pcVar20 = "Interior CubicBezierPoint point IsOffFigure() is false.";
                                goto LAB_0049740d;
                              }
                              goto LAB_00497414;
                            }
                          }
                          else {
                            bVar16 = ON_OutlineFigurePoint::IsOnFigure(&local_68);
                            if (!bVar16) {
                              uVar23 = (ulong)((int)local_58 + iVar18 + 1);
                              if (bLogErrors) {
                                iVar19 = 0xb3e;
                                pcVar20 = "End of QuadraticBezier point IsOnFigure() is false.";
LAB_0049740d:
                                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                           ,iVar19,"",pcVar20);
                              }
LAB_00497414:
                              uVar21 = (ulong)local_5c;
                              goto LAB_0049739a;
                            }
                          }
                          uVar21 = CONCAT71((int7)(uVar21 >> 8),2 < iVar18 + 2U);
                          pOVar24 = pOVar24 + 1;
                          iVar19 = iVar18 + 1;
                        } while (iVar18 + 1 != 2);
                        uVar23 = (ulong)((int)local_58 + iVar18 + 1);
LAB_0049739a:
                        if ((uVar21 & 1) == 0) {
                          return bVar15;
                        }
                      }
                      else if (uVar1 == QuadraticBezierPoint) {
                        bVar16 = ON_OutlineFigurePoint::IsOffFigure(&local_68);
                        if (!bVar16) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "Interior QuadraticBezier point IsOffFigure() is false.";
                          iVar19 = 0xaf6;
                          goto LAB_00496fdd;
                        }
                        uVar22 = (int)uVar23 + 1;
                        uVar23 = (ulong)uVar22;
                        if (OVar17 <= uVar22) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "Invalid QuadraticBezier segment.";
                          iVar19 = 0xafc;
                          goto LAB_00496fdd;
                        }
                        pOVar24 = pOVar4 + uVar22;
                        uVar2 = pOVar24->m_point_type;
                        uVar6 = pOVar24->m_point_proximity;
                        uVar9 = pOVar24->m_figure_index;
                        uVar12 = (pOVar24->m_point).x;
                        local_68.m_point.y = pOVar4[uVar22].m_point.y;
                        local_68.m_point_type = uVar2;
                        local_68.m_point_proximity = uVar6;
                        local_68.m_figure_index = uVar9;
                        local_68.m_point.x = (float)uVar12;
                        if (OVar14 != uVar9) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = 
                          "BeginFigure and interior point have different m_contour_index values.";
                          iVar19 = 0xb03;
                          goto LAB_00496fdd;
                        }
                        if (uVar2 != QuadraticBezierPoint) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "Invalid end of QuadraticBezier segment point type.";
                          iVar19 = 0xb09;
                          goto LAB_00496fdd;
                        }
                        bVar16 = ON_OutlineFigurePoint::IsOnFigure(&local_68);
                        if (!bVar16) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "End of QuadraticBezier point IsOnFigure() is false.";
                          iVar19 = 0xb0f;
                          goto LAB_00496fdd;
                        }
                      }
                      else {
                        if (uVar1 != LineTo) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "Invalid point type for figure interior.";
                          iVar19 = 0xb46;
                          goto LAB_00496fdd;
                        }
                        bVar16 = ON_OutlineFigurePoint::IsOnFigure(&local_68);
                        if (!bVar16) {
                          if (!bLogErrors) {
                            return bVar15;
                          }
                          pcVar20 = "LineTo point IsOnFigure() is false.";
                          iVar19 = 0xaec;
                          goto LAB_00496fdd;
                        }
                      }
                      uVar22 = (int)uVar23 + 1;
                      uVar23 = (ulong)uVar22;
                      bVar15 = OVar17 <= uVar22;
                      if (bVar15) {
                        return bVar15;
                      }
                    } while( true );
                  }
                  if (!bLogErrors) goto LAB_0049746f;
                  pcVar20 = "Open figure is not terminated with an EndFigureOpen point.";
                  bVar15 = false;
                  iVar19 = 0xad5;
                }
                else if (local_40.m_point_type == EndFigureClosed) {
                  bVar15 = ON_2fPoint::operator==(&local_50.m_point,&local_40.m_point);
                  if (bVar15) goto LAB_0049714a;
                  if (!bLogErrors) goto LAB_0049746f;
                  pcVar20 = "Closed figure has different start and end points.";
                  bVar15 = false;
                  iVar19 = 0xacd;
                }
                else {
                  if (!bLogErrors) goto LAB_0049746f;
                  pcVar20 = "Closed figure is not terminated with an EndFigureClosed point.";
                  bVar15 = false;
                  iVar19 = 0xac8;
                }
              }
              else {
                if (!bLogErrors) goto LAB_0049746f;
                pcVar20 = "EndFigure point IsOnFigure() is false.";
                bVar15 = false;
                iVar19 = 0xabf;
              }
            }
            else {
              if (!bLogErrors) goto LAB_0049746f;
              pcVar20 = "BeginFigure point IsOnFigure() is false.";
              bVar15 = false;
              iVar19 = 0xab9;
            }
          }
          else {
            if (!bLogErrors) goto LAB_0049746f;
            pcVar20 = "BeginFigure and EndFigure points have different m_contour_index values.";
            bVar15 = false;
            iVar19 = 0xab3;
          }
        }
      }
    }
    else {
      if (!bLogErrors) goto LAB_0049746f;
      pcVar20 = "m_points[0] is not a BeginFigure point.";
      bVar15 = false;
      iVar19 = 0xa9f;
    }
LAB_00496fdd:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,iVar19,"",pcVar20);
  }
  return bVar15;
}

Assistant:

bool ON_OutlineFigure::IsValidFigure(
  bool bLogErrors
) const
{
  const ON__UINT32 figure_end_dex = Internal_FigureEndDex(bLogErrors);
  if (0 == figure_end_dex)
  {
    return false;
  }

  const ON_OutlineFigurePoint* a = m_points.Array();


  const ON_OutlineFigurePoint figure_start = a[0];
  if (false == figure_start.IsBeginFigurePoint())
  {
    if ( bLogErrors ) ON_ERROR("m_points[0] is not a BeginFigure point.");
    return false;
  }
  if ( ON_OutlineFigurePoint::Type::BeginFigureUnknown == figure_start.m_point_type)
  {
    // Finished figures never have BeginFigureUnknown point type.
    if ( bLogErrors ) ON_ERROR("m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.");
    return false;
  }

  const ON__UINT16 figure_id = figure_start.m_figure_index;
  if (0 == figure_id)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point has 0 = m_contour_index.");
    return false;
  }

  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (figure_id != figure_end.m_figure_index)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure and EndFigure points have different m_contour_index values.");
    return false;
  }

  if ( false == figure_start.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point IsOnFigure() is false.");
    return false;
  }

  if (false == figure_end.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("EndFigure point IsOnFigure() is false.");
    return false;
  }

  const bool bClosedFigure = (ON_OutlineFigurePoint::Type::BeginFigureOpen != figure_start.m_point_type);
  if (bClosedFigure)
  {
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Closed figure is not terminated with an EndFigureClosed point.");
      return false;
    }
    if (false == (figure_start.m_point == figure_end.m_point))
    {
      if ( bLogErrors ) ON_ERROR("Closed figure has different start and end points.");
      return false;
    }
  }
  else
  {
    if (ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Open figure is not terminated with an EndFigureOpen point.");
      return false;
    }
  }

  // Validate EndFigure bToPoint setting.

  ON_OutlineFigurePoint p0, p1;
  p1 = figure_start;
  for (ON__UINT32 i = 1; i < figure_end_dex; i++)
  {
    p0 = p1;
    p1 = a[i];
    if (figure_id != p1.m_figure_index)
    {
      if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
      return false;
    }
    
    if (ON_OutlineFigurePoint::Type::LineTo == p1.m_point_type)
    {
      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("LineTo point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior QuadraticBezier point IsOffFigure() is false.");
        return false;
      }

      if (i + 1 >= figure_end_dex)
      {
        if (bLogErrors) ON_ERROR("Invalid QuadraticBezier segment.");
        return false;
      }

      p1 = a[++i];
      if (figure_id != p1.m_figure_index)
      {
        if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
        return false;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint != p1.m_point_type)
      {
        if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
        return false;
      }

      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
        return false;
      }

      for (int cv_dex = 2; cv_dex <= 3; cv_dex++)
      {
        if (i + 1 >= figure_end_dex)
        {
          if (bLogErrors) ON_ERROR("Invalid CubicBezierPoint segment.");
          return false;
        }

        p1 = a[++i];
        if (figure_id != p1.m_figure_index)
        {
          if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
          return false;
        }

        if (ON_OutlineFigurePoint::Type::CubicBezierPoint != p1.m_point_type)
        {
          if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
          return false;
        }

        if (2 == cv_dex)
        {
          if (false == p1.IsOffFigure())
          {
            if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
            return false;
          }
        }
        else
        {
          if (false == p1.IsOnFigure())
          {
            if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
            return false;
          }
        }
      }
      continue;
    }

    if (bLogErrors) ON_ERROR("Invalid point type for figure interior.");
    return false;
  }

  return true;
}